

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O0

float __thiscall
gimage::GaussKernel::convolveVertical<unsigned_char>
          (GaussKernel *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long i
          ,long k,int d)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  int in_R8D;
  int jj_1;
  long j_1;
  float ps;
  float pv_1;
  long j;
  int jj;
  float pv;
  long local_50;
  float local_48;
  float local_44;
  long local_40;
  int local_34;
  float local_30;
  
  if ((*(int *)((long)in_RDI + 0xc) <= in_RCX) &&
     (lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI),
     in_RCX < lVar4 - *(int *)((long)in_RDI + 0xc))) {
    local_30 = 0.0;
    local_34 = (int)in_RCX - *(int *)((long)in_RDI + 0xc);
    for (local_40 = 0; local_40 < (int)in_RDI[1]; local_40 = local_40 + 1) {
      fVar1 = *(float *)(*in_RDI + local_40 * 4);
      bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (in_RSI,in_RDX,(long)local_34,in_R8D);
      local_30 = fVar1 * (float)bVar2 + local_30;
      local_34 = local_34 + 1;
    }
    return local_30;
  }
  local_44 = 0.0;
  local_48 = 0.0;
  for (local_50 = 0; local_50 < (int)in_RDI[1]; local_50 = local_50 + 1) {
    iVar3 = ((int)in_RCX - *(int *)((long)in_RDI + 0xc)) + (int)local_50;
    if ((-1 < iVar3) &&
       (lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI),
       iVar3 < lVar4)) {
      fVar1 = *(float *)(*in_RDI + local_50 * 4);
      bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (in_RSI,in_RDX,(long)iVar3,in_R8D);
      local_44 = fVar1 * (float)bVar2 + local_44;
      local_48 = *(float *)(*in_RDI + local_50 * 4) + local_48;
    }
  }
  return local_44 / local_48;
}

Assistant:

inline float convolveVertical(const Image<T> &image,
        long i, long k, int d) const
    {
      if (k >= kn2 && k < image.getHeight()-kn2)
      {
        float pv=0;

        int jj=k-kn2;
        for (long j=0; j<kn; j++)
        {
          pv+=kernel[j]*image.get(i, jj++, d);
        }

        return pv;
      }
      else
      {
        float pv=0;
        float ps=0;

        for (long j=0; j<kn; j++)
        {
          int jj=k-kn2+j;

          if (jj >= 0 && jj < image.getHeight())
          {
            pv+=kernel[j]*image.get(i, jj, d);
            ps+=kernel[j];
          }
        }

        return pv/ps;
      }
    }